

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O1

char ** ssh2_all_fingerprints(ssh_key *data)

{
  ptrlen blob;
  strbuf *buf_o;
  char **ppcVar1;
  
  buf_o = strbuf_new();
  (*data->vt->public_blob)(data,buf_o->binarysink_);
  blob.ptr = buf_o->u;
  blob.len = buf_o->len;
  ppcVar1 = ssh2_all_fingerprints_for_blob(blob);
  strbuf_free(buf_o);
  return ppcVar1;
}

Assistant:

char **ssh2_all_fingerprints(ssh_key *data)
{
    strbuf *blob = strbuf_new();
    ssh_key_public_blob(data, BinarySink_UPCAST(blob));
    char **ret = ssh2_all_fingerprints_for_blob(ptrlen_from_strbuf(blob));
    strbuf_free(blob);
    return ret;
}